

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

size_type __thiscall re2::StringPiece::rfind(StringPiece *this,StringPiece *s,size_type pos)

{
  const_pointer pcVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  StringPiece *local_58;
  const_pointer result;
  char *local_30;
  const_pointer last;
  size_type pos_local;
  StringPiece *s_local;
  StringPiece *this_local;
  
  if (this->size_ < s->size_) {
    this_local = (StringPiece *)0xffffffffffffffff;
  }
  else {
    last = (const_pointer)pos;
    pos_local = (size_type)s;
    s_local = this;
    if (s->size_ == 0) {
      puVar2 = std::min<unsigned_long>(&this->size_,(unsigned_long *)&last);
      this_local = (StringPiece *)*puVar2;
    }
    else {
      pcVar1 = this->data_;
      result = (const_pointer)(this->size_ - s->size_);
      puVar2 = std::min<unsigned_long>((unsigned_long *)&result,(unsigned_long *)&last);
      local_30 = pcVar1 + *(long *)(pos_local + 8) + *puVar2;
      pcVar3 = std::find_end<char_const*,char_const*>
                         (this->data_,local_30,*(char **)pos_local,
                          (char *)(*(long *)pos_local + *(long *)(pos_local + 8)));
      if (pcVar3 == local_30) {
        local_58 = (StringPiece *)0xffffffffffffffff;
      }
      else {
        local_58 = (StringPiece *)(pcVar3 + -(long)this->data_);
      }
      this_local = local_58;
    }
  }
  return (size_type)this_local;
}

Assistant:

StringPiece::size_type StringPiece::rfind(const StringPiece& s,
                                          size_type pos) const {
  if (size_ < s.size_) return npos;
  if (s.size_ == 0) return std::min(size_, pos);
  const_pointer last = data_ + std::min(size_ - s.size_, pos) + s.size_;
  const_pointer result = std::find_end(data_, last, s.data_, s.data_ + s.size_);
  return result != last ? result - data_ : npos;
}